

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct32_low8_ssse3(__m128i *input,__m128i *output)

{
  undefined8 in_RDX;
  __m128i *cospi;
  int8_t in_R8B;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i __rounding;
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  __m128i local_218;
  __m128i local_208;
  longlong local_1f8;
  longlong lStack_1f0;
  longlong local_1e8;
  longlong lStack_1e0;
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  longlong lVar1;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  
  local_218 = *input;
  auVar3 = pshuflw(ZEXT416((uint)0xc9),ZEXT416((uint)0xc9),0);
  uVar2 = auVar3._0_4_;
  auVar6._4_4_ = uVar2;
  auVar6._0_4_ = uVar2;
  auVar6._8_4_ = uVar2;
  auVar6._12_4_ = uVar2;
  auVar7 = psllw(auVar6,3);
  auVar3 = pshuflw(ZEXT416((uint)0xffb),ZEXT416((uint)0xffb),0);
  auVar4._0_4_ = auVar3._0_4_;
  auVar4._4_4_ = auVar4._0_4_;
  auVar4._8_4_ = auVar4._0_4_;
  auVar4._12_4_ = auVar4._0_4_;
  auVar3 = psllw(auVar4,3);
  local_118 = pmulhrsw(auVar7,(undefined1  [16])input[1]);
  local_38 = pmulhrsw(auVar3,(undefined1  [16])input[1]);
  auVar3 = pshuflw(ZEXT416(0xffffd4e0),ZEXT416(0xffffd4e0),0);
  uVar2 = auVar3._0_4_;
  auVar10._4_4_ = uVar2;
  auVar10._0_4_ = uVar2;
  auVar10._8_4_ = uVar2;
  auVar10._12_4_ = uVar2;
  auVar3 = pshuflw(ZEXT416((uint)0xf11),ZEXT416((uint)0xf11),0);
  auVar9._0_4_ = auVar3._0_4_;
  auVar9._4_4_ = auVar9._0_4_;
  auVar9._8_4_ = auVar9._0_4_;
  auVar9._12_4_ = auVar9._0_4_;
  auVar3 = psllw(auVar9,3);
  local_f8 = pmulhrsw(auVar10,(undefined1  [16])input[7]);
  local_58 = pmulhrsw(auVar3,(undefined1  [16])input[7]);
  auVar3 = pshuflw(ZEXT416((uint)0x3e3),ZEXT416((uint)0x3e3),0);
  auVar12._0_4_ = auVar3._0_4_;
  auVar12._4_4_ = auVar12._0_4_;
  auVar12._8_4_ = auVar12._0_4_;
  auVar12._12_4_ = auVar12._0_4_;
  auVar3 = psllw(auVar12,3);
  auVar7 = pshuflw(ZEXT416((uint)0xf85),ZEXT416((uint)0xf85),0);
  auVar13._0_4_ = auVar7._0_4_;
  auVar13._4_4_ = auVar13._0_4_;
  auVar13._8_4_ = auVar13._0_4_;
  auVar13._12_4_ = auVar13._0_4_;
  auVar7 = psllw(auVar13,3);
  local_d8 = pmulhrsw(auVar3,(undefined1  [16])input[5]);
  local_78 = pmulhrsw(auVar7,(undefined1  [16])input[5]);
  auVar3 = pshuflw(ZEXT416(0xffffed38),ZEXT416(0xffffed38),0);
  uVar2 = auVar3._0_4_;
  auVar15._4_4_ = uVar2;
  auVar15._0_4_ = uVar2;
  auVar15._8_4_ = uVar2;
  auVar15._12_4_ = uVar2;
  auVar3 = pshuflw(ZEXT416((uint)0xfd4),ZEXT416((uint)0xfd4),0);
  uVar2 = auVar3._0_4_;
  auVar16._4_4_ = uVar2;
  auVar16._0_4_ = uVar2;
  auVar16._8_4_ = uVar2;
  auVar16._12_4_ = uVar2;
  auVar3 = psllw(auVar16,3);
  local_b8 = pmulhrsw(auVar15,(undefined1  [16])input[3]);
  local_98 = pmulhrsw(auVar3,(undefined1  [16])input[3]);
  auVar3 = pshuflw(ZEXT416((uint)0x191),ZEXT416((uint)0x191),0);
  auVar11._0_4_ = auVar3._0_4_;
  auVar11._4_4_ = auVar11._0_4_;
  auVar11._8_4_ = auVar11._0_4_;
  auVar11._12_4_ = auVar11._0_4_;
  auVar3 = psllw(auVar11,3);
  auVar7 = pshuflw(ZEXT416((uint)0xfec),ZEXT416((uint)0xfec),0);
  auVar14._0_4_ = auVar7._0_4_;
  auVar14._4_4_ = auVar14._0_4_;
  auVar14._8_4_ = auVar14._0_4_;
  auVar14._12_4_ = auVar14._0_4_;
  auVar7 = psllw(auVar14,3);
  local_198 = pmulhrsw(auVar3,(undefined1  [16])input[2]);
  local_138 = pmulhrsw(auVar7,(undefined1  [16])input[2]);
  auVar3 = pshuflw(ZEXT416(0xffffdad8),ZEXT416(0xffffdad8),0);
  auVar8._0_4_ = auVar3._0_4_;
  auVar8._4_4_ = auVar8._0_4_;
  auVar8._8_4_ = auVar8._0_4_;
  auVar8._12_4_ = auVar8._0_4_;
  auVar3 = pshuflw(ZEXT416((uint)0xf50),ZEXT416((uint)0xf50),0);
  auVar17._0_4_ = auVar3._0_4_;
  auVar17._4_4_ = auVar17._0_4_;
  auVar17._8_4_ = auVar17._0_4_;
  auVar17._12_4_ = auVar17._0_4_;
  auVar3 = psllw(auVar17,3);
  local_178 = pmulhrsw(auVar8,(undefined1  [16])input[6]);
  local_158 = pmulhrsw(auVar3,(undefined1  [16])input[6]);
  auVar3 = pshuflw(ZEXT416((uint)799),ZEXT416((uint)799),0);
  auVar7._0_4_ = auVar3._0_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  auVar3 = psllw(auVar7,3);
  auVar7 = pshuflw(ZEXT416((uint)0xfb1),ZEXT416((uint)0xfb1),0);
  auVar5._0_4_ = auVar7._0_4_;
  auVar5._4_4_ = auVar5._0_4_;
  auVar5._8_4_ = auVar5._0_4_;
  auVar5._12_4_ = auVar5._0_4_;
  auVar7 = psllw(auVar5,3);
  local_1d8 = pmulhrsw(auVar3,(undefined1  [16])input[4]);
  local_1a8 = pmulhrsw(auVar7,(undefined1  [16])input[4]);
  __rounding[1]._0_4_ = 0xffffed38;
  __rounding[0] = in_RDX;
  __rounding[1]._4_4_ = 0;
  lVar1 = 0xffffed38;
  cospi = output;
  local_188 = local_198;
  local_168 = local_178;
  local_148 = local_158;
  local_128 = local_138;
  local_108 = local_118;
  local_e8 = local_f8;
  local_c8 = local_d8;
  local_a8 = local_b8;
  local_88 = local_98;
  local_68 = local_78;
  local_48 = local_58;
  local_28 = local_38;
  idct32_high16_stage4_sse2(&local_218,(int32_t *)output,__rounding,in_R8B);
  auVar3 = pshuflw(ZEXT416((uint)0xb50),ZEXT416((uint)0xb50),0);
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  auVar3 = psllw(auVar3,3);
  local_218 = (__m128i)pmulhrsw(auVar3,(undefined1  [16])local_218);
  local_1c8 = local_1d8._0_8_;
  uStack_1c0 = local_1d8._8_8_;
  local_1b8 = local_1a8._0_8_;
  uStack_1b0 = local_1a8._8_8_;
  __rounding_00[1] = lVar1;
  __rounding_00[0] = extraout_RDX;
  local_208 = local_218;
  idct32_high24_stage5_sse2(&local_218,(int32_t *)cospi,__rounding_00,in_R8B);
  local_1e8 = local_218[0];
  lStack_1e0 = local_218[1];
  local_1f8 = local_208[0];
  lStack_1f0 = local_208[1];
  __rounding_01[1] = lVar1;
  __rounding_01[0] = extraout_RDX_00;
  idct32_high28_stage6_sse2(&local_218,(int32_t *)cospi,__rounding_01,in_R8B);
  __rounding_02[1] = lVar1;
  __rounding_02[0] = extraout_RDX_01;
  idct32_stage7_sse2(&local_218,(int32_t *)cospi,__rounding_02,in_R8B);
  __rounding_03[1] = lVar1;
  __rounding_03[0] = extraout_RDX_02;
  idct32_stage8_sse2(&local_218,(int32_t *)cospi,__rounding_03,in_R8B);
  idct32_stage9_sse2(output,&local_218);
  return;
}

Assistant:

static void idct32_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m128i x[32];
  x[0] = input[0];
  x[4] = input[4];
  x[8] = input[2];
  x[12] = input[6];
  x[16] = input[1];
  x[20] = input[5];
  x[24] = input[3];
  x[28] = input[7];

  // stage 2
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);

  // stage 3
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];

  // stage 4
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct32_high16_stage4_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  idct32_high24_stage5_sse2(x, cospi, __rounding, cos_bit);
  // stage 6
  x[3] = x[0];
  x[2] = x[1];
  idct32_high28_stage6_sse2(x, cospi, __rounding, cos_bit);

  idct32_stage7_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage8_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage9_sse2(output, x);
}